

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLFormatter.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLFormatter::XMLFormatter
          (XMLFormatter *this,char *outEncoding,XMLFormatTarget *target,EscapeFlags escapeFlags,
          UnRepFlags unrepFlags,MemoryManager *manager)

{
  XMLCh *pXVar1;
  XMLTranscoder *pXVar2;
  TranscodingException *this_00;
  Codes local_34;
  MemoryManager *pMStack_30;
  Codes resCode;
  MemoryManager *manager_local;
  UnRepFlags unrepFlags_local;
  EscapeFlags escapeFlags_local;
  XMLFormatTarget *target_local;
  char *outEncoding_local;
  XMLFormatter *this_local;
  
  pMStack_30 = manager;
  manager_local._0_4_ = unrepFlags;
  manager_local._4_4_ = escapeFlags;
  _unrepFlags_local = target;
  target_local = (XMLFormatTarget *)outEncoding;
  outEncoding_local = (char *)this;
  XMemory::XMemory((XMemory *)this);
  this->fEscapeFlags = manager_local._4_4_;
  this->fOutEncoding = (XMLCh *)0x0;
  this->fTarget = _unrepFlags_local;
  this->fUnRepFlags = (UnRepFlags)manager_local;
  this->fXCoder = (XMLTranscoder *)0x0;
  this->fAposRef = (XMLByte *)0x0;
  this->fAposLen = 0;
  this->fAmpRef = (XMLByte *)0x0;
  this->fAmpLen = 0;
  this->fGTRef = (XMLByte *)0x0;
  this->fGTLen = 0;
  this->fLTRef = (XMLByte *)0x0;
  this->fLTLen = 0;
  this->fQuoteRef = (XMLByte *)0x0;
  this->fQuoteLen = 0;
  this->fIsXML11 = false;
  this->fMemoryManager = pMStack_30;
  pXVar1 = XMLString::transcode((char *)target_local,this->fMemoryManager);
  this->fOutEncoding = pXVar1;
  pXVar2 = XMLTransService::makeNewTranscoderFor
                     (XMLPlatformUtils::fgTransService,this->fOutEncoding,&local_34,0x4000,
                      this->fMemoryManager);
  this->fXCoder = pXVar2;
  if (this->fXCoder == (XMLTranscoder *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fOutEncoding);
    this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
    TranscodingException::TranscodingException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/framework/XMLFormatter.cpp"
               ,0x126,Trans_CantCreateCvtrFor,(char *)target_local,(char *)0x0,(char *)0x0,
               (char *)0x0,this->fMemoryManager);
    __cxa_throw(this_00,&TranscodingException::typeinfo,TranscodingException::~TranscodingException)
    ;
  }
  this->fIsXML11 = false;
  return;
}

Assistant:

XMLFormatter::XMLFormatter( const   char* const             outEncoding
                            ,       XMLFormatTarget* const  target
                            , const EscapeFlags             escapeFlags
                            , const UnRepFlags              unrepFlags
                            ,       MemoryManager* const    manager)
    : fEscapeFlags(escapeFlags)
    , fOutEncoding(0)
    , fTarget(target)
    , fUnRepFlags(unrepFlags)
    , fXCoder(0)
    , fAposRef(0)
    , fAposLen(0)
    , fAmpRef(0)
    , fAmpLen(0)
    , fGTRef(0)
    , fGTLen(0)
    , fLTRef(0)
    , fLTLen(0)
    , fQuoteRef(0)
    , fQuoteLen(0)
    , fIsXML11(false)
    , fMemoryManager(manager)
{
    // this constructor uses "1.0" for the docVersion

    // Transcode the encoding string
    fOutEncoding = XMLString::transcode(outEncoding, fMemoryManager);

    // Try to create a transcoder for this encoding
    XMLTransService::Codes resCode;
    fXCoder = XMLPlatformUtils::fgTransService->makeNewTranscoderFor
    (
        fOutEncoding
        , resCode
        , kTmpBufSize
        , fMemoryManager
    );

    if (!fXCoder)
    {
        fMemoryManager->deallocate(fOutEncoding); //delete [] fOutEncoding;
        ThrowXMLwithMemMgr1
        (
            TranscodingException
            , XMLExcepts::Trans_CantCreateCvtrFor
            , outEncoding
            , fMemoryManager
        );
    }

    //XMLCh* const tmpDocVer = XMLString::transcode("1.0", fMemoryManager);
    //ArrayJanitor<XMLCh> jname(tmpDocVer, fMemoryManager);
    //fIsXML11 = XMLString::equals(tmpDocVer, XMLUni::fgVersion1_1);
    fIsXML11 = false;  // docVersion 1.0 is not 1.1!
}